

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
handle_query_item_decodedKey
          (char *key,size_t keyLen,char *value,size_t valueLen,curi_settings *settings,
          void *userData)

{
  int iVar1;
  char *output;
  char *urlDecodedValue;
  size_t urlDecodedValueLen;
  size_t valueAllocationSize;
  double dStack_60;
  curi_status status;
  double doubleValue;
  char *valueEnd_1;
  long intValue;
  char *valueEnd;
  void *userData_local;
  curi_settings *settings_local;
  size_t valueLen_local;
  char *value_local;
  size_t keyLen_local;
  char *key_local;
  
  valueEnd = (char *)userData;
  userData_local = settings;
  settings_local = (curi_settings *)valueLen;
  valueLen_local = (size_t)value;
  value_local = (char *)keyLen;
  keyLen_local = (size_t)key;
  if ((settings->query_item_null_callback == (_func_int_void_ptr_char_ptr_size_t *)0x0) ||
     (valueLen != 0)) {
    if ((valueLen != 0) &&
       (settings->query_item_int_callback != (_func_int_void_ptr_char_ptr_size_t_long *)0x0)) {
      intValue = 0;
      valueEnd_1 = (char *)0x0;
      valueEnd_1 = (char *)strtol(value,(char **)&intValue,10);
      if (intValue == (long)&settings_local->allocate + valueLen_local) {
        iVar1 = (**(code **)((long)userData_local + 0x58))
                          (valueEnd,keyLen_local,value_local,valueEnd_1);
        if (iVar1 == 0) {
          return curi_status_canceled;
        }
        return curi_status_success;
      }
    }
    if ((settings_local != (curi_settings *)0x0) && (*(long *)((long)userData_local + 0x60) != 0)) {
      doubleValue = 0.0;
      dStack_60 = 0.0;
      dStack_60 = strtod((char *)valueLen_local,(char **)&doubleValue);
      if (doubleValue == (double)((long)&settings_local->allocate + valueLen_local)) {
        iVar1 = (**(code **)((long)userData_local + 0x60))
                          (dStack_60,valueEnd,keyLen_local,value_local);
        if (iVar1 == 0) {
          return curi_status_canceled;
        }
        return curi_status_success;
      }
    }
    if (*(long *)((long)userData_local + 0x68) == 0) {
      key_local._4_4_ = curi_status_success;
    }
    else if (*(int *)((long)userData_local + 0x80) == 0) {
      iVar1 = (**(code **)((long)userData_local + 0x68))
                        (valueEnd,keyLen_local,value_local,valueLen_local,settings_local);
      if (iVar1 == 0) {
        key_local._4_4_ = curi_status_canceled;
      }
      else {
        key_local._4_4_ = curi_status_success;
      }
    }
    else {
      valueAllocationSize._4_4_ = 0;
      urlDecodedValueLen = (long)&settings_local->allocate + 1;
      urlDecodedValue = (char *)0x0;
      output = (char *)(**userData_local)(valueEnd,urlDecodedValueLen);
      valueAllocationSize._4_4_ =
           curi_url_decode((char *)valueLen_local,(size_t)settings_local,output,
                           (size_t)((long)&settings_local->allocate + 1),(size_t *)&urlDecodedValue)
      ;
      if ((valueAllocationSize._4_4_ == curi_status_success) &&
         (iVar1 = (**(code **)((long)userData_local + 0x68))
                            (valueEnd,keyLen_local,value_local,output,urlDecodedValue), iVar1 == 0))
      {
        valueAllocationSize._4_4_ = curi_status_canceled;
      }
      (**(code **)((long)userData_local + 8))(valueEnd,output,urlDecodedValueLen);
      key_local._4_4_ = valueAllocationSize._4_4_;
    }
  }
  else {
    iVar1 = (*settings->query_item_null_callback)(userData,key,keyLen);
    if (iVar1 == 0) {
      key_local._4_4_ = curi_status_canceled;
    }
    else {
      key_local._4_4_ = curi_status_success;
    }
  }
  return key_local._4_4_;
}

Assistant:

static curi_status handle_query_item_decodedKey(const char* key, size_t keyLen, const char* value, size_t valueLen, const curi_settings* settings, void* userData)
{
    // Key is valid, callbacks exist
    if (settings->query_item_null_callback)
    {
        if (valueLen == 0)
        {
            if (settings->query_item_null_callback(userData, key, keyLen) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
    }

    if (valueLen != 0 && settings->query_item_int_callback)
    {
        char* valueEnd = 0;
        long int intValue = 0;
        intValue = strtol(value,&valueEnd,10); // Trying to parse an integer
        if (valueEnd == value + valueLen)
        {
            if (settings->query_item_int_callback(userData, key, keyLen, intValue) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
    }

    if (valueLen != 0 && settings->query_item_double_callback)
    {
        char* valueEnd = 0;
        double doubleValue = 0;
        doubleValue = strtod(value,&valueEnd); // Trying to parse a double
        if (valueEnd == value + valueLen)
        {
            if (settings->query_item_double_callback(userData, key, keyLen, doubleValue) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
    }

    if (settings->query_item_str_callback)
    {
        if (settings->url_decode == 0)
        {
            if (settings->query_item_str_callback(userData, key, keyLen, value, valueLen) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
        else
        {
            curi_status status = curi_status_success;

            size_t valueAllocationSize = (valueLen+1) * sizeof(char);
            size_t urlDecodedValueLen = 0;
            char* urlDecodedValue = (char*)settings->allocate(userData, valueAllocationSize);

            status = curi_url_decode(value,valueLen,urlDecodedValue,valueLen+1,&urlDecodedValueLen);

            if (status == curi_status_success)
                if (settings->query_item_str_callback(userData, key, keyLen, urlDecodedValue, urlDecodedValueLen) == 0)
                    status =  curi_status_canceled;

            settings->deallocate(userData, urlDecodedValue, valueAllocationSize);

            return status;
        }
    }

    return curi_status_success;
}